

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  Primitive *prim;
  byte bVar14;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar15;
  NodeRef *pNVar16;
  byte bVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  undefined1 auVar31 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar32;
  vint4 ai_2;
  vint4 ai;
  undefined1 auVar33 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  vint4 ai_3;
  undefined1 auVar34 [16];
  vint4 bi;
  vint4 bi_1;
  undefined1 auVar35 [16];
  vint4 bi_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_2;
  undefined1 auVar38 [64];
  vint4 bi_8;
  undefined1 auVar39 [64];
  vbool<4>_conflict valid0;
  InstanceIntersectorK<4> local_3572;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar23;
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar22 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar24 = ZEXT816(0) << 0x40;
    uVar8 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar24,5);
    uVar18 = vpcmpeqd_avx512vl(auVar22,(undefined1  [16])valid_i->field_0);
    uVar18 = ((byte)uVar8 & 0xf) & uVar18;
    bVar17 = (byte)uVar18;
    if (bVar17 != 0) {
      auVar22 = *(undefined1 (*) [16])(ray + 0x40);
      auVar34 = *(undefined1 (*) [16])(ray + 0x50);
      auVar3 = *(undefined1 (*) [16])(ray + 0x60);
      auVar19._8_4_ = 0x7fffffff;
      auVar19._0_8_ = 0x7fffffff7fffffff;
      auVar19._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx(auVar22,auVar19);
      auVar20._8_4_ = 0x219392ef;
      auVar20._0_8_ = 0x219392ef219392ef;
      auVar20._12_4_ = 0x219392ef;
      uVar9 = vcmpps_avx512vl(auVar25,auVar20,1);
      bVar5 = (bool)((byte)uVar9 & 1);
      auVar25._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar22._0_4_;
      bVar5 = (bool)((byte)(uVar9 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar22._4_4_;
      bVar5 = (bool)((byte)(uVar9 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar22._8_4_;
      bVar5 = (bool)((byte)(uVar9 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar22._12_4_;
      auVar22 = vandps_avx(auVar34,auVar19);
      uVar9 = vcmpps_avx512vl(auVar22,auVar20,1);
      bVar5 = (bool)((byte)uVar9 & 1);
      auVar31._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._0_4_;
      bVar5 = (bool)((byte)(uVar9 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._4_4_;
      bVar5 = (bool)((byte)(uVar9 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._8_4_;
      bVar5 = (bool)((byte)(uVar9 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._12_4_;
      auVar22 = vandps_avx(auVar3,auVar19);
      uVar9 = vcmpps_avx512vl(auVar22,auVar20,1);
      bVar5 = (bool)((byte)uVar9 & 1);
      auVar22._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar3._0_4_;
      bVar5 = (bool)((byte)(uVar9 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar3._4_4_;
      bVar5 = (bool)((byte)(uVar9 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar3._8_4_;
      bVar5 = (bool)((byte)(uVar9 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar3._12_4_;
      auVar19 = vrcp14ps_avx512vl(auVar25);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar3 = vfnmadd213ps_fma(auVar25,auVar19,auVar34);
      auVar20 = vrcp14ps_avx512vl(auVar31);
      auVar25 = vfnmadd213ps_fma(auVar31,auVar20,auVar34);
      auVar21 = vrcp14ps_avx512vl(auVar22);
      auVar31 = vfnmadd213ps_fma(auVar22,auVar21,auVar34);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar38 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar22 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar24);
      aVar23._0_4_ = (uint)(bVar17 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar17 & 1) * 0x7f800000;
      bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
      aVar23._4_4_ = (uint)bVar5 * auVar22._4_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
      aVar23._8_4_ = (uint)bVar5 * auVar22._8_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = SUB81(uVar18 >> 3,0);
      aVar23._12_4_ = (uint)bVar5 * auVar22._12_4_ | (uint)!bVar5 * 0x7f800000;
      auVar22 = *(undefined1 (*) [16])ray;
      auVar34 = *(undefined1 (*) [16])(ray + 0x10);
      auVar36._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar36._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar36._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar34 = *(undefined1 (*) [16])(ray + 0x20);
      auVar33._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar33._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar33._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar34 = vfmadd132ps_fma(auVar25,auVar20,auVar20);
      auVar24 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar24);
      bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
      bVar7 = SUB81(uVar18 >> 3,0);
      auVar39 = ZEXT1664(CONCAT412((uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * -0x800000,
                                   CONCAT48((uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * -0x800000,
                                            CONCAT44((uint)bVar5 * auVar24._4_4_ |
                                                     (uint)!bVar5 * -0x800000,
                                                     (uint)(bVar17 & 1) * auVar24._0_4_ |
                                                     (uint)!(bool)(bVar17 & 1) * -0x800000))));
      auVar24 = vfmadd132ps_fma(auVar3,auVar19,auVar19);
      auVar3 = vfmadd132ps_fma(auVar31,auVar21,auVar21);
      bVar14 = (byte)((ushort)((short)uVar18 << 0xc) >> 0xc) ^ 0xf;
      pNVar16 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar15 = &stack_near[2].field_0;
      stack_near[1].field_0 = aVar23;
      auVar21._0_4_ = auVar24._0_4_ * -auVar22._0_4_;
      auVar21._4_4_ = auVar24._4_4_ * -auVar22._4_4_;
      auVar21._8_4_ = auVar24._8_4_ * -auVar22._8_4_;
      auVar21._12_4_ = auVar24._12_4_ * -auVar22._12_4_;
      auVar22 = vmulps_avx512vl(auVar34,auVar36);
      auVar25 = vmulps_avx512vl(auVar3,auVar33);
LAB_01d857d1:
      pNVar1 = pNVar16 + -1;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        pNVar16 = pNVar16 + -1;
        aVar32 = paVar15[-1];
        paVar15 = paVar15 + -1;
        auVar31 = auVar39._0_16_;
        uVar8 = vcmpps_avx512vl((undefined1  [16])aVar32,auVar31,1);
        sVar13 = pNVar1->ptr;
        if ((char)uVar8 != '\0') {
          do {
            if ((sVar13 & 8) != 0) {
              if (sVar13 == 0xfffffffffffffff8) goto LAB_01d85a0a;
              uVar8 = vcmpps_avx512vl(auVar31,(undefined1  [16])aVar32,6);
              if ((char)uVar8 != '\0') {
                valid0.v = ~bVar14 & 0xf;
                lVar12 = (ulong)((uint)sVar13 & 0xf) - 7;
                prim = (Primitive *)(sVar13 & 0xfffffffffffffff0);
                goto LAB_01d85957;
              }
              break;
            }
            sVar11 = 8;
            aVar32 = auVar38._0_16_;
            for (lVar12 = 0;
                (lVar12 != 8 &&
                (sVar4 = *(size_t *)((sVar13 & 0xfffffffffffffff0) + lVar12 * 8), sVar4 != 8));
                lVar12 = lVar12 + 1) {
              uVar2 = *(undefined4 *)(sVar13 + 0x40 + lVar12 * 4);
              auVar26._4_4_ = uVar2;
              auVar26._0_4_ = uVar2;
              auVar26._8_4_ = uVar2;
              auVar26._12_4_ = uVar2;
              auVar33 = vfmadd132ps_fma(auVar26,auVar21,auVar24);
              uVar2 = *(undefined4 *)(sVar13 + 0x80 + lVar12 * 4);
              auVar27._4_4_ = uVar2;
              auVar27._0_4_ = uVar2;
              auVar27._8_4_ = uVar2;
              auVar27._12_4_ = uVar2;
              auVar26 = vfmadd132ps_avx512vl(auVar27,auVar22,auVar34);
              uVar2 = *(undefined4 *)(sVar13 + 0xc0 + lVar12 * 4);
              auVar28._4_4_ = uVar2;
              auVar28._0_4_ = uVar2;
              auVar28._8_4_ = uVar2;
              auVar28._12_4_ = uVar2;
              auVar27 = vfmadd132ps_avx512vl(auVar28,auVar25,auVar3);
              uVar2 = *(undefined4 *)(sVar13 + 0x60 + lVar12 * 4);
              auVar29._4_4_ = uVar2;
              auVar29._0_4_ = uVar2;
              auVar29._8_4_ = uVar2;
              auVar29._12_4_ = uVar2;
              auVar36 = vfmadd132ps_fma(auVar29,auVar21,auVar24);
              uVar2 = *(undefined4 *)(sVar13 + 0xa0 + lVar12 * 4);
              auVar35._4_4_ = uVar2;
              auVar35._0_4_ = uVar2;
              auVar35._8_4_ = uVar2;
              auVar35._12_4_ = uVar2;
              auVar28 = vfmadd132ps_avx512vl(auVar35,auVar22,auVar34);
              uVar2 = *(undefined4 *)(sVar13 + 0xe0 + lVar12 * 4);
              auVar37._4_4_ = uVar2;
              auVar37._0_4_ = uVar2;
              auVar37._8_4_ = uVar2;
              auVar37._12_4_ = uVar2;
              auVar29 = vfmadd132ps_avx512vl(auVar37,auVar25,auVar3);
              auVar19 = vpminsd_avx(auVar33,auVar36);
              auVar20 = vpminsd_avx(auVar26,auVar28);
              auVar19 = vpmaxsd_avx(auVar19,auVar20);
              auVar20 = vpminsd_avx(auVar27,auVar29);
              auVar19 = vpmaxsd_avx(auVar19,auVar20);
              auVar20 = vpmaxsd_avx(auVar33,auVar36);
              auVar33 = vpmaxsd_avx(auVar26,auVar28);
              auVar36 = vpminsd_avx(auVar20,auVar33);
              auVar20 = vpmaxsd_avx(auVar27,auVar29);
              auVar33 = vpmaxsd_avx(auVar19,(undefined1  [16])aVar23);
              auVar20 = vpminsd_avx(auVar20,auVar31);
              auVar20 = vpminsd_avx(auVar36,auVar20);
              uVar18 = vpcmpd_avx512vl(auVar33,auVar20,2);
              uVar18 = uVar18 & 0xf;
              sVar10 = sVar11;
              aVar30 = aVar32;
              if ((byte)uVar18 != 0) {
                auVar20 = vblendmps_avx512vl((undefined1  [16])auVar38._0_16_,auVar19);
                bVar5 = (bool)((byte)uVar18 & 1);
                aVar30._0_4_ = (uint)bVar5 * auVar20._0_4_ | (uint)!bVar5 * auVar19._0_4_;
                bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
                aVar30._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar19._4_4_;
                bVar5 = (bool)((byte)(uVar18 >> 2) & 1);
                aVar30._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar19._8_4_;
                bVar5 = SUB81(uVar18 >> 3,0);
                aVar30._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar19._12_4_;
                sVar10 = sVar4;
                if (sVar11 != 8) {
                  pNVar16->ptr = sVar11;
                  pNVar16 = pNVar16 + 1;
                  *paVar15 = aVar32;
                  paVar15 = paVar15 + 1;
                }
              }
              aVar32 = aVar30;
              sVar11 = sVar10;
            }
            sVar13 = sVar11;
          } while (sVar11 != 8);
        }
        goto LAB_01d857d1;
      }
LAB_01d85a0a:
      bVar14 = bVar14 & bVar17;
      bVar5 = (bool)(bVar14 >> 1 & 1);
      bVar6 = (bool)(bVar14 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar14 & 1) * -0x800000 | (uint)!(bool)(bVar14 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar14 >> 3) * -0x800000 | (uint)!(bool)(bVar14 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    InstanceIntersectorK<4>::occluded(&local_3572,&valid0,&pre,ray,context,prim);
    auVar39 = ZEXT1664(auVar31);
    auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    valid0.v = ~(byte)local_3572 & valid0.v & 0xf;
    prim = prim + 1;
    if (valid0.v == 0) break;
LAB_01d85957:
    lVar12 = lVar12 + -1;
    auVar19 = auVar39._0_16_;
    if (lVar12 == 0) goto LAB_01d859e3;
  }
  valid0.v = 0;
  auVar19 = auVar31;
LAB_01d859e3:
  bVar14 = bVar14 | valid0.v ^ 0xf;
  if (bVar14 == 0xf) {
    bVar14 = 0xf;
    goto LAB_01d85a0a;
  }
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar5 = (bool)(bVar14 >> 1 & 1);
  bVar6 = (bool)(bVar14 >> 2 & 1);
  auVar39 = ZEXT1664(CONCAT412((uint)(bVar14 >> 3) * auVar31._12_4_ |
                               (uint)!(bool)(bVar14 >> 3) * auVar19._12_4_,
                               CONCAT48((uint)bVar6 * auVar31._8_4_ | (uint)!bVar6 * auVar19._8_4_,
                                        CONCAT44((uint)bVar5 * auVar31._4_4_ |
                                                 (uint)!bVar5 * auVar19._4_4_,
                                                 (uint)(bVar14 & 1) * auVar31._0_4_ |
                                                 (uint)!(bool)(bVar14 & 1) * auVar19._0_4_))));
  goto LAB_01d857d1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }